

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

double sampleSimplex2D(PerlinNoise *noise,double x,double y)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  double y_00;
  double in_XMM1_Qa;
  double t;
  int gi2;
  int gi1;
  int gi0;
  double y2;
  double x2;
  double y1;
  double x1;
  int offz;
  int offx;
  double y0;
  double x0;
  double mhxz;
  int hz;
  int hx;
  double hf;
  double UNSKEW;
  double SKEW;
  undefined4 in_stack_ffffffffffffff78;
  
  dVar8 = sqrt(3.0);
  dVar9 = sqrt(3.0);
  dVar9 = (3.0 - dVar9) / 6.0;
  dVar8 = (in_XMM0_Qa + in_XMM1_Qa) * (dVar8 - 1.0) * 0.5;
  dVar10 = floor(in_XMM0_Qa + dVar8);
  iVar3 = (int)dVar10;
  dVar8 = floor(in_XMM1_Qa + dVar8);
  uVar4 = (uint)dVar8;
  dVar8 = (double)(int)(iVar3 + uVar4) * dVar9;
  dVar10 = in_XMM0_Qa - ((double)iVar3 - dVar8);
  dVar8 = in_XMM1_Qa - ((double)(int)uVar4 - dVar8);
  uVar5 = (uint)(dVar8 < dVar10);
  uVar6 = (uint)((uVar5 != 0 ^ 0xffU) & 1);
  dVar10 = dVar9 + dVar9 + (dVar10 - 1.0);
  y_00 = dVar9 + dVar9 + (dVar8 - 1.0);
  bVar1 = *(byte *)(in_RDI + (int)((uint)*(byte *)(in_RDI + (int)(uVar4 & 0xff)) + iVar3 & 0xff));
  uVar7 = (uint)bVar1;
  uVar5 = (uint)*(byte *)(in_RDI + (int)((uint)*(byte *)(in_RDI + (int)(uVar4 + uVar6 & 0xff)) +
                                         iVar3 + uVar5 & 0xff));
  bVar2 = *(byte *)(in_RDI + (int)((uint)*(byte *)(in_RDI + (int)(uVar4 + 1 & 0xff)) + iVar3 + 1 &
                                  0xff));
  uVar4 = (uint)bVar2;
  iVar3 = (int)((ulong)((dVar8 - (double)uVar6) + dVar9) >> 0x20);
  dVar8 = simplexGrad(iVar3,dVar10,y_00,(double)(ulong)CONCAT14(bVar1,uVar5),
                      (double)(ulong)CONCAT14(bVar2,in_stack_ffffffffffffff78));
  dVar9 = simplexGrad(iVar3,dVar10,y_00,(double)CONCAT44(uVar7,uVar5),
                      (double)CONCAT44(uVar4,in_stack_ffffffffffffff78));
  dVar10 = simplexGrad(iVar3,dVar10,y_00,(double)CONCAT44(uVar7,uVar5),
                       (double)CONCAT44(uVar4,in_stack_ffffffffffffff78));
  return (dVar10 + dVar9 + dVar8 + 0.0) * 70.0;
}

Assistant:

double sampleSimplex2D(const PerlinNoise *noise, double x, double y)
{
    const double SKEW = 0.5 * (sqrt(3) - 1.0);
    const double UNSKEW = (3.0 - sqrt(3)) / 6.0;

    double hf = (x + y) * SKEW;
    int hx = (int)floor(x + hf);
    int hz = (int)floor(y + hf);
    double mhxz = (hx + hz) * UNSKEW;
    double x0 = x - (hx - mhxz);
    double y0 = y - (hz - mhxz);
    int offx = (x0 > y0);
    int offz = !offx;
    double x1 = x0 - offx + UNSKEW;
    double y1 = y0 - offz + UNSKEW;
    double x2 = x0 - 1.0 + 2.0 * UNSKEW;
    double y2 = y0 - 1.0 + 2.0 * UNSKEW;
    int gi0 = noise->d[0xff & (hz)];
    int gi1 = noise->d[0xff & (hz + offz)];
    int gi2 = noise->d[0xff & (hz + 1)];
    gi0 = noise->d[0xff & (gi0 + hx)];
    gi1 = noise->d[0xff & (gi1 + hx + offx)];
    gi2 = noise->d[0xff & (gi2 + hx + 1)];
    double t = 0;
    t += simplexGrad(gi0 % 12, x0, y0, 0.0, 0.5);
    t += simplexGrad(gi1 % 12, x1, y1, 0.0, 0.5);
    t += simplexGrad(gi2 % 12, x2, y2, 0.0, 0.5);
    return 70.0 * t;
}